

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

bool __thiscall nite::UDPSocket::setNonBlocking(UDPSocket *this,bool m)

{
  int iVar1;
  bool bVar2;
  
  if (this->nonBlocking == m) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    iVar1 = fcntl(this->sock,4,0x800,(ulong)m);
    if (iVar1 == -1) {
      this->nonBlocking = m;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool nite::UDPSocket::setNonBlocking(bool m){
	if (m == nonBlocking){
		return false;
	}
	#ifdef _WIN32
		u_long b = m ? 1 : 0;
		if (ioctlsocket(sock, FIONBIO, &b) != 0){
			nonBlocking = m; // TODO: add proper error handling
			return true;
		}
	#else
		if (fcntl(sock, F_SETFL, O_NONBLOCK, m) == -1){
			nonBlocking = m; // TODO: add proper error handling
			return true;
		}
	#endif
	return false;
}